

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontConfig::ImFontConfig(ImFontConfig *this)

{
  this->FontData = (void *)0x0;
  this->FontDataSize = 0;
  this->FontDataOwnedByAtlas = true;
  this->FontNo = 0;
  this->SizePixels = 0.0;
  this->OversampleH = 3;
  this->OversampleV = 1;
  this->PixelSnapH = false;
  (this->GlyphExtraSpacing).x = 0.0;
  (this->GlyphExtraSpacing).y = 0.0;
  this->DstFont = (ImFont *)0x0;
  this->GlyphRanges = (ImWchar *)0x0;
  this->MergeMode = false;
  this->MergeGlyphCenterV = false;
  this->Name[0] = '\0';
  this->Name[1] = '\0';
  this->Name[2] = '\0';
  this->Name[3] = '\0';
  this->Name[4] = '\0';
  this->Name[5] = '\0';
  this->Name[6] = '\0';
  this->Name[7] = '\0';
  this->Name[8] = '\0';
  this->Name[9] = '\0';
  this->Name[10] = '\0';
  this->Name[0xb] = '\0';
  this->Name[0xc] = '\0';
  this->Name[0xd] = '\0';
  this->Name[0xe] = '\0';
  this->Name[0xf] = '\0';
  this->Name[0x10] = '\0';
  this->Name[0x11] = '\0';
  this->Name[0x12] = '\0';
  this->Name[0x13] = '\0';
  this->Name[0x14] = '\0';
  this->Name[0x15] = '\0';
  this->Name[0x10] = '\0';
  this->Name[0x11] = '\0';
  this->Name[0x12] = '\0';
  this->Name[0x13] = '\0';
  this->Name[0x14] = '\0';
  this->Name[0x15] = '\0';
  this->Name[0x16] = '\0';
  this->Name[0x17] = '\0';
  this->Name[0x18] = '\0';
  this->Name[0x19] = '\0';
  this->Name[0x1a] = '\0';
  this->Name[0x1b] = '\0';
  this->Name[0x1c] = '\0';
  this->Name[0x1d] = '\0';
  this->Name[0x1e] = '\0';
  this->Name[0x1f] = '\0';
  return;
}

Assistant:

ImFontConfig::ImFontConfig()
{
    FontData = NULL;
    FontDataSize = 0;
    FontDataOwnedByAtlas = true;
    FontNo = 0;
    SizePixels = 0.0f;
    OversampleH = 3;
    OversampleV = 1;
    PixelSnapH = false;
    GlyphExtraSpacing = ImVec2(0.0f, 0.0f);
    GlyphRanges = NULL;
    MergeMode = false;
    MergeGlyphCenterV = false;
    DstFont = NULL;
    memset(Name, 0, sizeof(Name));
}